

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareNull::runTestCase(TestValueTestcompareNull *this)

{
  Value *in_RDI;
  PredicateContext _minitest_Context;
  undefined4 uVar1;
  ValueType in_stack_ffffffffffffff6c;
  ValueTest *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff90;
  undefined4 local_38 [2];
  char *local_30;
  undefined4 local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_28 = 0x553;
  local_20 = "checkIsEqual(Json::Value(), Json::Value())";
  local_18 = 0;
  local_10 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_38;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_38;
  uVar1 = 0;
  Json::Value::Value((Value *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  Json::Value::Value((Value *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  ValueTest::checkIsEqual
            (in_stack_ffffffffffffff70,(Value *)CONCAT44(in_stack_ffffffffffffff6c,uVar1),in_RDI);
  Json::Value::~Value(in_stack_ffffffffffffff90);
  Json::Value::~Value(in_stack_ffffffffffffff90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareNull) {
  JSONTEST_ASSERT_PRED(checkIsEqual(Json::Value(), Json::Value()));
}